

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O1

double opn2_loopStartTime(OPN2_MIDIPlayer *device)

{
  return -1.0;
}

Assistant:

OPNMIDI_EXPORT double opn2_loopStartTime(struct OPN2_MIDIPlayer *device)
{
#ifndef OPNMIDI_DISABLE_MIDI_SEQUENCER
    if(!device)
        return -1.0;
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    return play->m_sequencer->getLoopStart();
#else
    ADL_UNUSED(device);
    return -1.0;
#endif
}